

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TaskNode.cpp
# Opt level: O0

ostream * operator<<(ostream *out,TaskNode *taskNode)

{
  TaskNode *this;
  bool bVar1;
  ostream *poVar2;
  size_type sVar3;
  reference ppTVar4;
  string *psVar5;
  TaskNode *dependant;
  const_iterator __end1;
  const_iterator __begin1;
  list<TaskNode_*,_std::allocator<TaskNode_*>_> *__range1;
  TaskNode *taskNode_local;
  ostream *out_local;
  
  poVar2 = std::operator<<(out,"Task: ");
  poVar2 = std::operator<<(poVar2,(string *)taskNode);
  poVar2 = std::operator<<(poVar2,". Dependants: ");
  sVar3 = std::__cxx11::list<TaskNode_*,_std::allocator<TaskNode_*>_>::size(&taskNode->dependant);
  std::ostream::operator<<(poVar2,sVar3);
  __end1 = std::__cxx11::list<TaskNode_*,_std::allocator<TaskNode_*>_>::begin(&taskNode->dependant);
  dependant = (TaskNode *)
              std::__cxx11::list<TaskNode_*,_std::allocator<TaskNode_*>_>::end(&taskNode->dependant)
  ;
  while( true ) {
    bVar1 = std::operator!=(&__end1,(_Self *)&dependant);
    if (!bVar1) break;
    ppTVar4 = std::_List_const_iterator<TaskNode_*>::operator*(&__end1);
    this = *ppTVar4;
    poVar2 = std::operator<<(out,'\n');
    psVar5 = TaskNode::getName_abi_cxx11_(this);
    std::operator<<(poVar2,(string *)psVar5);
    std::_List_const_iterator<TaskNode_*>::operator++(&__end1);
  }
  return out;
}

Assistant:

std::ostream &operator<<(std::ostream &out, const TaskNode &taskNode) {
    out << "Task: " << taskNode.name << ". Dependants: " << taskNode.dependant.size();

    for (TaskNode *dependant : taskNode.dependant) {
        out << '\n' << dependant->getName();
    }

    return out;
}